

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fDepthStencilTests.cpp
# Opt level: O3

void __thiscall deqp::gles3::Functional::DepthStencilCase::~DepthStencilCase(DepthStencilCase *this)

{
  ~DepthStencilCase(this);
  operator_delete(this,0x148);
  return;
}

Assistant:

DepthStencilCase::~DepthStencilCase (void)
{
	delete m_renderer;
	delete m_refColorBuffer;
	delete m_refDepthBuffer;
	delete m_refStencilBuffer;
	delete m_refRenderer;
}